

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

cargo_validation_t *
cargo_validate_choices(cargo_validate_choices_flags_t flags,cargo_type_t type,size_t count,...)

{
  cargo_type_t cVar1;
  char in_AL;
  void *pvVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_200;
  undefined8 *local_1e8;
  undefined8 *local_1d0;
  double *local_1b0;
  undefined4 *local_190;
  undefined4 *local_178;
  undefined8 *local_160;
  double local_128 [4];
  undefined8 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  cargo_type_t *local_70;
  cargo_choices_validation_t *vc;
  cargo_validation_t *v;
  cargo_astr_t str;
  size_t i;
  va_list ap;
  size_t count_local;
  cargo_type_t type_local;
  cargo_validate_choices_flags_t flags_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Da;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  vc = (cargo_choices_validation_t *)0x0;
  local_70 = (cargo_type_t *)0x0;
  local_128[3] = (double)in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  memset(&v,0,0x20);
  local_70 = (cargo_type_t *)_cargo_calloc(1,0x38);
  if (local_70 == (cargo_type_t *)0x0) {
    _type_local = (cargo_choices_validation_t *)0x0;
  }
  else {
    vc = (cargo_choices_validation_t *)
         cargo_create_validator
                   ("choices",_cargo_validate_choices_cb,_cargo_validate_choices_destroy_cb,
                    CARGO_ULONGLONG|CARGO_LONGLONG|CARGO_STRING|CARGO_DOUBLE|CARGO_FLOAT|CARGO_UINT|
                    CARGO_INT,local_70);
    if (vc == (cargo_choices_validation_t *)0x0) {
      _cargo_free(local_70);
      _type_local = (cargo_choices_validation_t *)0x0;
    }
    else {
      local_70[10] = flags;
      *local_70 = type;
      *(size_t *)(local_70 + 2) = count;
      if (*local_70 == CARGO_STRING) {
        pvVar2 = _cargo_calloc(*(undefined8 *)(local_70 + 2),8);
        *(void **)(local_70 + 4) = pvVar2;
      }
      else {
        pvVar2 = _cargo_calloc(*(undefined8 *)(local_70 + 2),8);
        *(void **)(local_70 + 6) = pvVar2;
      }
      if (pvVar2 == (void *)0x0) {
LAB_0010cdfc:
        _cargo_xfree(local_70 + 4);
        _cargo_xfree(local_70 + 6);
        _cargo_xfree(local_70 + 0xc);
        _cargo_free(local_70);
        _cargo_free(vc);
        _type_local = (cargo_choices_validation_t *)0x0;
      }
      else {
        v = (cargo_validation_t *)(local_70 + 0xc);
        str.s = (char **)(count * 0x14);
        ap[0]._0_8_ = &stack0x00000008;
        i._4_4_ = 0x30;
        if ((local_70[10] & CARGO_INT) == 0) {
          local_70[8] = 0xd1d243ac;
          local_70[9] = 0x3c32725d;
        }
        else {
          i._4_4_ = 0x40;
          *(ulong *)(local_70 + 8) = CONCAT44(uStack_f4,local_f8);
        }
        i._0_4_ = 0x18;
        for (str.diff = 0; str.diff < (ulong)*(undefined8 *)(local_70 + 2); str.diff = str.diff + 1)
        {
          cVar1 = *local_70;
          if (cVar1 == CARGO_INT) {
            if ((uint)i < 0x29) {
              local_178 = (undefined4 *)((long)local_128 + (long)(int)(uint)i);
              i._0_4_ = (uint)i + 8;
            }
            else {
              local_178 = (undefined4 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(undefined4 *)(*(undefined8 *)(local_70 + 6) + str.diff * 8) = *local_178;
            cargo_aappendf((cargo_astr_t *)&v,"%d",
                           (ulong)*(uint *)(*(undefined8 *)(local_70 + 6) + str.diff * 8));
          }
          else if (cVar1 == CARGO_UINT) {
            if ((uint)i < 0x29) {
              local_190 = (undefined4 *)((long)local_128 + (long)(int)(uint)i);
              i._0_4_ = (uint)i + 8;
            }
            else {
              local_190 = (undefined4 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(undefined4 *)(*(undefined8 *)(local_70 + 6) + str.diff * 8) = *local_190;
            cargo_aappendf((cargo_astr_t *)&v,"%u",
                           (ulong)*(uint *)(*(undefined8 *)(local_70 + 6) + str.diff * 8));
          }
          else if (cVar1 == CARGO_FLOAT) {
            if (i._4_4_ < 0xa1) {
              local_1b0 = (double *)((long)local_128 + (long)(int)i._4_4_);
              i._4_4_ = i._4_4_ + 0x10;
            }
            else {
              local_1b0 = (double *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(float *)(*(undefined8 *)(local_70 + 6) + str.diff * 8) = (float)*local_1b0;
            cargo_aappendf((cargo_astr_t *)&v,"%.2f",
                           SUB84((double)*(float *)(*(undefined8 *)(local_70 + 6) + str.diff * 8),0)
                          );
          }
          else if (cVar1 == CARGO_DOUBLE) {
            if (i._4_4_ < 0xa1) {
              local_1d0 = (undefined8 *)((long)local_128 + (long)(int)i._4_4_);
              i._4_4_ = i._4_4_ + 0x10;
            }
            else {
              local_1d0 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(undefined8 *)(*(undefined8 *)(local_70 + 6) + str.diff * 8) = *local_1d0;
            cargo_aappendf((cargo_astr_t *)&v,"%.2f",
                           (int)*(undefined8 *)(*(undefined8 *)(local_70 + 6) + str.diff * 8));
          }
          else if (cVar1 == CARGO_STRING) {
            if ((uint)i < 0x29) {
              local_160 = (undefined8 *)((long)local_128 + (long)(int)(uint)i);
              i._0_4_ = (uint)i + 8;
            }
            else {
              local_160 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            pcVar3 = _cargo_strdup((char *)*local_160);
            *(char **)(*(undefined8 *)(local_70 + 4) + str.diff * 8) = pcVar3;
            if (pcVar3 == (char *)0x0) goto LAB_0010cdfc;
            cargo_aappendf((cargo_astr_t *)&v,"%s",
                           *(undefined8 *)(*(undefined8 *)(local_70 + 4) + str.diff * 8));
          }
          else if (cVar1 == CARGO_LONGLONG) {
            if ((uint)i < 0x29) {
              local_1e8 = (undefined8 *)((long)local_128 + (long)(int)(uint)i);
              i._0_4_ = (uint)i + 8;
            }
            else {
              local_1e8 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(undefined8 *)(*(undefined8 *)(local_70 + 6) + str.diff * 8) = *local_1e8;
            cargo_aappendf((cargo_astr_t *)&v,"%lld",
                           *(undefined8 *)(*(undefined8 *)(local_70 + 6) + str.diff * 8));
          }
          else if (cVar1 == CARGO_ULONGLONG) {
            if ((uint)i < 0x29) {
              local_200 = (undefined8 *)((long)local_128 + (long)(int)(uint)i);
              i._0_4_ = (uint)i + 8;
            }
            else {
              local_200 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(undefined8 *)(*(undefined8 *)(local_70 + 6) + str.diff * 8) = *local_200;
            cargo_aappendf((cargo_astr_t *)&v,"%llu",
                           *(undefined8 *)(*(undefined8 *)(local_70 + 6) + str.diff * 8));
          }
          if ((ulong)(str.diff + CARGO_BOOL) < (ulong)*(undefined8 *)(local_70 + 2)) {
            cargo_aappendf((cargo_astr_t *)&v,", ");
          }
        }
        _type_local = vc;
      }
    }
  }
  return (cargo_validation_t *)_type_local;
}

Assistant:

cargo_validation_t *cargo_validate_choices(cargo_validate_choices_flags_t flags,
                                            cargo_type_t type,
                                            size_t count, ...)
{
    va_list ap;
    size_t i;
    cargo_astr_t str;
    cargo_validation_t *v = NULL;
    cargo_choices_validation_t *vc = NULL;
    memset(&str, 0, sizeof(str));

    if (!(vc = _cargo_calloc(1, sizeof(cargo_choices_validation_t))))
    {
        return NULL;
    }

    if (!(v = cargo_create_validator("choices",
                _cargo_validate_choices_cb,
                _cargo_validate_choices_destroy_cb,
                (CARGO_STRING | CARGO_INT | CARGO_UINT | CARGO_FLOAT |
                 CARGO_DOUBLE | CARGO_LONGLONG | CARGO_ULONGLONG),
                vc)))
    {
        _cargo_free(vc);
        return NULL;
    }

    vc->flags = flags;
    vc->type = type;
    vc->count = count;

    if (vc->type == CARGO_STRING)
    {
        if (!(vc->strs = _cargo_calloc(vc->count, sizeof(char *))))
        {
            CARGODBG(1, "Out of memory\n");
            goto fail;
        }
    }
    else
    {
        if (!(vc->nums = _cargo_calloc(vc->count, sizeof(cargo_vals_t))))
        {
            CARGODBG(1, "Out of memory\n");
            goto fail;
        }
    }

    // Start out with room strings of 20 chars
    // to keep reallocation to a minimum.
    str.s = &vc->err;
    str.l = count * 20;

    va_start(ap, count);

    if (vc->flags & CARGO_VALIDATE_CHOICES_SET_EPSILON)
    {
        vc->epsilon = va_arg(ap, double);
    }
    else
    {
        vc->epsilon = CARGO_DEFAULT_EPSILON;
    }

    for (i = 0; i < vc->count; i++)
    {
        switch (vc->type)
        {
            case CARGO_STRING:
            {
                if (!(vc->strs[i] = _cargo_strdup(va_arg(ap, char *))))
                {
                    goto fail;
                }

                cargo_aappendf(&str, "%s", vc->strs[i]);
                break;
            }
            case CARGO_INT:
            {
                vc->nums[i].i = va_arg(ap, int);
                cargo_aappendf(&str, "%d", vc->nums[i].i);
                break;
            }
            case CARGO_UINT:
            {
                vc->nums[i].u = va_arg(ap, unsigned int);
                cargo_aappendf(&str, "%u", vc->nums[i].u);
                break;
            }
            case CARGO_FLOAT:
            {
                vc->nums[i].f = (float)va_arg(ap, double);
                cargo_aappendf(&str, "%.2f", vc->nums[i].f);
                break;
            }
            case CARGO_DOUBLE:
            {
                vc->nums[i].d = va_arg(ap, double);
                cargo_aappendf(&str, "%.2f", vc->nums[i].d);
                break;
            }
            case CARGO_LONGLONG:
            {
                vc->nums[i].ll = va_arg(ap, long long int);
                cargo_aappendf(&str, "%"CARGO_LONGLONG_FMT, vc->nums[i].ll);
                break;
            }
            case CARGO_ULONGLONG:
            {
                vc->nums[i].ull = va_arg(ap, unsigned long long int);
                cargo_aappendf(&str, "%"CARGO_ULONGLONG_FMT, vc->nums[i].ull);
                break;
            }
            default:
                break;
        }

        if (i + 1 < vc->count)
        {
            cargo_aappendf(&str, ", ");
        }
    }

    va_end(ap);

    return v;
fail:
    _cargo_xfree(&vc->strs);
    _cargo_xfree(&vc->nums);
    _cargo_xfree(&vc->err);
    _cargo_free(vc);
    _cargo_free(v);
    return NULL;
}